

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O2

int OCTET_STRING_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
                      void *app_key)

{
  int iVar1;
  int iVar2;
  long lVar3;
  byte *pbVar4;
  char *pcVar5;
  byte *pbVar6;
  ulong uVar7;
  char scratch [52];
  
  if (sptr == (void *)0x0) {
LAB_0014632b:
    iVar1 = (*cb)("<absent>",8,app_key);
    iVar1 = iVar1 >> 0x1f;
  }
  else {
    pbVar6 = *sptr;
    lVar3 = (long)*(int *)((long)sptr + 8);
    if (pbVar6 == (byte *)0x0) {
      if (*(int *)((long)sptr + 8) != 0) goto LAB_0014632b;
      lVar3 = 0;
    }
    pbVar4 = pbVar6 + lVar3;
    uVar7 = 0;
    if (ilevel < 1) {
      ilevel = 0;
    }
    pcVar5 = scratch;
    for (; pbVar6 < pbVar4; pbVar6 = pbVar6 + 1) {
      if (((uVar7 & 0xf) == 0) && ((uVar7 != 0 || (0x10 < *(int *)((long)sptr + 8))))) {
        iVar1 = (*cb)(scratch,(long)pcVar5 - (long)scratch,app_key);
        if (iVar1 < 0) {
          return -1;
        }
        pcVar5 = "\n";
        iVar1 = ilevel + 1;
        while( true ) {
          iVar2 = (*cb)(pcVar5,1,app_key);
          if (iVar2 < 0) {
            return -1;
          }
          iVar1 = iVar1 + -1;
          if (iVar1 == 0) break;
          pcVar5 = " ";
        }
        pcVar5 = scratch;
      }
      *pcVar5 = "0123456789ABCDEF"[*pbVar6 >> 4];
      pcVar5[1] = "0123456789ABCDEF"[*pbVar6 & 0xf];
      pcVar5[2] = ' ';
      pcVar5 = pcVar5 + 3;
      uVar7 = uVar7 + 1;
    }
    if ((scratch < pcVar5) &&
       (iVar1 = (*cb)(scratch,(size_t)(pcVar5 + ~(ulong)scratch),app_key), iVar1 < 0)) {
      return -1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
OCTET_STRING_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
	asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	char scratch[16 * 3 + 4];
	char *p = scratch;
	uint8_t *buf;
	uint8_t *end;
	size_t i;

	(void)td;	/* Unused argument */

	if(!st || (!st->buf && st->size))
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;

	/*
	 * Dump the contents of the buffer in hexadecimal.
	 */
	buf = st->buf;
	end = buf + st->size;
	for(i = 0; buf < end; buf++, i++) {
		if(!(i % 16) && (i || st->size > 16)) {
			if(cb(scratch, p - scratch, app_key) < 0)
				return -1;
			_i_INDENT(1);
			p = scratch;
		}
		*p++ = h2c[(*buf >> 4) & 0x0F];
		*p++ = h2c[*buf & 0x0F];
		*p++ = 0x20;
	}

	if(p > scratch) {
		p--;	/* Remove the tail space */
		if(cb(scratch, p - scratch, app_key) < 0)
			return -1;
	}

	return 0;
}